

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O0

size_t zmMontCreate_deep(size_t no)

{
  ulong n_00;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  long in_RDI;
  size_t n;
  
  n_00 = in_RDI + 7U >> 3;
  sVar1 = zzMod_deep(n_00,n_00);
  sVar2 = zmMulMont_deep(sVar1);
  sVar3 = zmSqrMont_deep(sVar1);
  sVar4 = zmInvMont_deep(0x16b7bb);
  sVar5 = zmDivMont_deep(sVar1);
  sVar1 = utilMax(5,sVar1,sVar2,sVar3,sVar4,sVar5);
  return sVar1;
}

Assistant:

size_t zmMontCreate_deep(size_t no)
{
	const size_t n = W_OF_O(no);
	return utilMax(5,
		zzMod_deep(n, n),
		zmMulMont_deep(n),
		zmSqrMont_deep(n),
		zmInvMont_deep(n),
		zmDivMont_deep(n));
}